

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void hash_process_addnl(cf_chash *H,void *input,size_t ninput,uint8_t *V,size_t nV)

{
  undefined1 local_1e0 [8];
  cf_chash_ctx ctx;
  uint8_t w [64];
  uint8_t two;
  size_t nV_local;
  uint8_t *V_local;
  size_t ninput_local;
  void *input_local;
  cf_chash *H_local;
  
  if (ninput != 0) {
    w[0x3f] = '\x02';
    (*H->init)(local_1e0);
    (*H->update)(local_1e0,w + 0x3f,1);
    (*H->update)(local_1e0,V,nV);
    (*H->update)(local_1e0,input,ninput);
    (*H->digest)(local_1e0,ctx.ctx + 0x160);
    add(V,nV,ctx.ctx + 0x160,H->hashsz);
  }
  return;
}

Assistant:

static void hash_process_addnl(const cf_chash *H,
                               const void *input, size_t ninput,
                               uint8_t *V, size_t nV)
{
  if (!ninput)
    return;

  /* 2.1. w = Hash(0x02 || V || additional_input) */
  uint8_t two = 2;
  uint8_t w[CF_MAXHASH];
  cf_chash_ctx ctx;
  H->init(&ctx);
  H->update(&ctx, &two, sizeof two);
  H->update(&ctx, V, nV);
  H->update(&ctx, input, ninput);
  H->digest(&ctx, w);

  /* 2.2. V = (V + w) mod 2 ^ seedlen */
  add(V, nV, w, H->hashsz);
}